

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O0

bool __thiscall wallet::CWallet::UnlockCoin(CWallet *this,COutPoint *output,WalletBatch *batch)

{
  long lVar1;
  size_type sVar2;
  long in_RDX;
  COutPoint *in_RSI;
  WalletBatch *in_RDI;
  long in_FS_OFFSET;
  bool was_locked;
  int in_stack_ffffffffffffffbc;
  undefined7 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc7;
  WalletBatch *this_00;
  undefined1 local_9;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  AssertLockHeldInternal<AnnotatedMixin<std::recursive_mutex>>
            ((char *)in_RDI,(char *)CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0),
             in_stack_ffffffffffffffbc,(AnnotatedMixin<std::recursive_mutex> *)0x1a7c3e);
  sVar2 = std::set<COutPoint,_std::less<COutPoint>,_std::allocator<COutPoint>_>::erase
                    ((set<COutPoint,_std::less<COutPoint>,_std::allocator<COutPoint>_> *)in_RDI,
                     (key_type *)CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0));
  if ((in_RDX == 0) || (sVar2 == 0)) {
    local_9 = true;
  }
  else {
    local_9 = WalletBatch::EraseLockedUTXO(this_00,in_RSI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_9;
  }
  __stack_chk_fail();
}

Assistant:

bool CWallet::UnlockCoin(const COutPoint& output, WalletBatch* batch)
{
    AssertLockHeld(cs_wallet);
    bool was_locked = setLockedCoins.erase(output);
    if (batch && was_locked) {
        return batch->EraseLockedUTXO(output);
    }
    return true;
}